

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmGlobalUnixMakefileGenerator3::AddCXXCompileCommand
          (cmGlobalUnixMakefileGenerator3 *this,string *sourceFile,string *workingDirectory,
          string *compileCommand,string *objPath)

{
  cmGeneratedFileStream *pcVar1;
  _Alloc_hider _Var2;
  string *__lhs;
  ostream *poVar3;
  string commandDatabaseName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  pcVar1 = (this->CommandDatabase)._M_t.
           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
  if (pcVar1 == (cmGeneratedFileStream *)0x0) {
    __lhs = cmake::GetHomeOutputDirectory_abi_cxx11_
                      ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance);
    std::operator+(&local_90,__lhs,"/compile_commands.json");
    std::make_unique<cmGeneratedFileStream,std::__cxx11::string&>(&local_b0);
    _Var2._M_p = local_b0._M_dataplus._M_p;
    local_b0._M_dataplus._M_p = (pointer)0x0;
    pcVar1 = (this->CommandDatabase)._M_t.
             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl;
    (this->CommandDatabase)._M_t.
    super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>._M_t.
    super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
    super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl =
         (cmGeneratedFileStream *)_Var2._M_p;
    if (pcVar1 != (cmGeneratedFileStream *)0x0) {
      (**(code **)(*(long *)&(pcVar1->super_ofstream).
                             super_basic_ostream<char,_std::char_traits<char>_> + 8))();
      if ((cmGeneratedFileStream *)local_b0._M_dataplus._M_p != (cmGeneratedFileStream *)0x0) {
        (**(code **)(*(long *)local_b0._M_dataplus._M_p + 8))();
      }
    }
    std::operator<<((ostream *)
                    (this->CommandDatabase)._M_t.
                    super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                    .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,"[\n");
    std::__cxx11::string::~string((string *)&local_90);
  }
  else {
    std::operator<<((ostream *)pcVar1,",\n");
  }
  poVar3 = std::operator<<((ostream *)
                           (this->CommandDatabase)._M_t.
                           super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                           .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,"{\n"
                          );
  poVar3 = std::operator<<(poVar3,"  \"directory\": \"");
  cmGlobalGenerator::EscapeJSON(&local_90,workingDirectory);
  poVar3 = std::operator<<(poVar3,(string *)&local_90);
  poVar3 = std::operator<<(poVar3,"\",\n");
  poVar3 = std::operator<<(poVar3,"  \"command\": \"");
  cmGlobalGenerator::EscapeJSON(&local_b0,compileCommand);
  poVar3 = std::operator<<(poVar3,(string *)&local_b0);
  poVar3 = std::operator<<(poVar3,"\",\n");
  poVar3 = std::operator<<(poVar3,"  \"file\": \"");
  cmGlobalGenerator::EscapeJSON(&local_50,sourceFile);
  poVar3 = std::operator<<(poVar3,(string *)&local_50);
  poVar3 = std::operator<<(poVar3,"\",\n");
  poVar3 = std::operator<<(poVar3,"  \"output\": \"");
  cmGlobalGenerator::EscapeJSON(&local_70,objPath);
  poVar3 = std::operator<<(poVar3,(string *)&local_70);
  std::operator<<(poVar3,"\"\n}");
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::AddCXXCompileCommand(
  const std::string& sourceFile, const std::string& workingDirectory,
  const std::string& compileCommand, const std::string& objPath)
{
  if (!this->CommandDatabase) {
    std::string commandDatabaseName =
      this->GetCMakeInstance()->GetHomeOutputDirectory() +
      "/compile_commands.json";
    this->CommandDatabase =
      cm::make_unique<cmGeneratedFileStream>(commandDatabaseName);
    *this->CommandDatabase << "[\n";
  } else {
    *this->CommandDatabase << ",\n";
  }
  *this->CommandDatabase << "{\n"
                         << R"(  "directory": ")"
                         << cmGlobalGenerator::EscapeJSON(workingDirectory)
                         << "\",\n"
                         << R"(  "command": ")"
                         << cmGlobalGenerator::EscapeJSON(compileCommand)
                         << "\",\n"
                         << R"(  "file": ")"
                         << cmGlobalGenerator::EscapeJSON(sourceFile)
                         << "\",\n"
                         << R"(  "output": ")"
                         << cmGlobalGenerator::EscapeJSON(objPath) << "\"\n}";
}